

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O0

MDDEntry * __thiscall ASDCP::Dictionary::FindSymbol(Dictionary *this,string *str)

{
  bool bVar1;
  ILogSink *this_00;
  undefined8 uVar2;
  pointer ppVar3;
  _Self local_30;
  _Self local_28;
  const_iterator i;
  string *str_local;
  Dictionary *this_local;
  
  i._M_node = (_Base_ptr)str;
  if (*this->m_MDD_Table[0].name != '\0') {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ::find(&this->m_md_sym_lookup,str);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ::end(&this->m_md_sym_lookup);
    bVar1 = std::operator==(&local_28,&local_30);
    if (bVar1) {
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      uVar2 = std::__cxx11::string::c_str();
      Kumu::ILogSink::Warn(this_00,"UL Dictionary: unknown symbol: %s\n",uVar2);
      this_local = (Dictionary *)0x0;
    }
    else {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               ::operator->(&local_28);
      this_local = (Dictionary *)(this->m_MDD_Table + ppVar3->second);
    }
    return (MDDEntry *)this_local;
  }
  __assert_fail("m_MDD_Table[0].name[0]",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Dict.cpp"
                ,0x16e,
                "const ASDCP::MDDEntry *ASDCP::Dictionary::FindSymbol(const std::string &) const");
}

Assistant:

const ASDCP::MDDEntry*
ASDCP::Dictionary::FindSymbol(const std::string& str) const
{
  assert(m_MDD_Table[0].name[0]);
  std::map<std::string, ui32_t>::const_iterator i = m_md_sym_lookup.find(str);
  
  if ( i == m_md_sym_lookup.end() )
    {
      Kumu::DefaultLogSink().Warn("UL Dictionary: unknown symbol: %s\n", str.c_str());
      return 0;
    }

  return &m_MDD_Table[i->second];
}